

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap_iterator.hpp
# Opt level: O1

void __thiscall
burst::
bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::bitap_iterator(bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,searcher_type *bitap,text_range_type *text)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_begin;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  iVar2;
  
  (this->m_bitap).m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (bitap->m_bitmask_table).
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (bitap->m_bitmask_table).
           super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_bitap).m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_hint = 0;
  corpus_begin._M_current = (text->_M_dataplus)._M_p;
  iVar2 = (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           )algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>::
            find_first<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((bitap<char,unsigned_short,std::array<unsigned_short,256ul>> *)this,
                       corpus_begin,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(corpus_begin._M_current + text->_M_string_length),&this->m_hint);
  (this->m_match).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
       = iVar2;
  (this->m_text_end)._M_current = (text->_M_dataplus)._M_p + text->_M_string_length;
  return;
}

Assistant:

bitap_iterator (searcher_type bitap, const text_range_type & text):
            m_bitap(std::move(bitap)),
            m_hint(0b0),
            m_match(m_bitap.find_first(text.begin(), text.end(), m_hint)),
            m_text_end(text.end())
        {
        }